

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestApplyResult(void)

{
  float fVar1;
  ImGuiContext_conflict *pIVar2;
  bool bVar3;
  float local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_34 [8];
  ImRect rect_abs;
  float scroll_target;
  ImVec2 delta_scroll;
  ImGuiNavItemData *result;
  ImGuiContext_conflict *g;
  
  pIVar2 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    if ((GImGui->NavMoveResultOther).ID == 0) {
      local_60.x = 0.0;
      local_60.y = 0.0;
    }
    else {
      local_60 = (ImVec2)&GImGui->NavMoveResultOther;
    }
    local_58 = local_60;
  }
  else {
    local_58 = (ImVec2)&GImGui->NavMoveResultLocal;
  }
  delta_scroll = local_58;
  if (local_58 == (ImVec2)0x0) {
    if ((GImGui->NavMoveFlags & 0x200U) != 0) {
      GImGui->NavMoveFlags = GImGui->NavMoveFlags | 0x800;
    }
    if (pIVar2->NavId == 0) {
      return;
    }
    if ((pIVar2->NavMoveFlags & 0x800U) != 0) {
      return;
    }
    pIVar2->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    return;
  }
  if ((((GImGui->NavMoveFlags & 0x20U) != 0) && ((GImGui->NavMoveResultLocalVisible).ID != 0)) &&
     ((GImGui->NavMoveResultLocalVisible).ID != GImGui->NavId)) {
    delta_scroll = (ImVec2)&GImGui->NavMoveResultLocalVisible;
  }
  if (((delta_scroll != (ImVec2)&GImGui->NavMoveResultOther) &&
      ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    if (*(float *)((long)delta_scroll + 0x24) <= (GImGui->NavMoveResultOther).DistBox) {
      fVar1 = (GImGui->NavMoveResultOther).DistBox;
      if (((fVar1 != *(float *)((long)delta_scroll + 0x24)) ||
          (NAN(fVar1) || NAN(*(float *)((long)delta_scroll + 0x24)))) ||
         (*(float *)((long)delta_scroll + 0x28) <= (GImGui->NavMoveResultOther).DistCenter))
      goto LAB_00203a37;
    }
    delta_scroll = (ImVec2)&GImGui->NavMoveResultOther;
  }
LAB_00203a37:
  bVar3 = false;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    bVar3 = *(long *)delta_scroll != 0;
  }
  if (bVar3) {
    if (GImGui->NavLayer == ImGuiNavLayer_Main) {
      ImVec2::ImVec2((ImVec2 *)&rect_abs.Max.y);
      if ((pIVar2->NavMoveFlags & 0x40U) == 0) {
        local_3c = operator+((ImVec2 *)((long)delta_scroll + 0x10),
                             (ImVec2 *)(*(long *)delta_scroll + 0x48));
        local_44 = operator+((ImVec2 *)((long)delta_scroll + 0x18),
                             (ImVec2 *)(*(long *)delta_scroll + 0x48));
        ImRect::ImRect((ImRect *)local_34,&local_3c,&local_44);
        register0x00001200 =
             ScrollToRectEx(*(ImGuiWindow **)delta_scroll,(ImRect *)local_34,
                            pIVar2->NavMoveScrollFlags);
      }
      else {
        if (pIVar2->NavMoveDir == 2) {
          local_68 = *(float *)(*(long *)delta_scroll + 0xa0);
        }
        else {
          local_68 = 0.0;
        }
        rect_abs.Max.x = local_68;
        scroll_target = *(float *)(*(long *)delta_scroll + 0x98) - local_68;
        SetScrollY(*(ImGuiWindow **)delta_scroll,local_68);
      }
      ImRect::TranslateX((ImRect *)((long)delta_scroll + 0x10),-rect_abs.Max.y);
      ImRect::TranslateY((ImRect *)((long)delta_scroll + 0x10),-scroll_target);
    }
    ClearActiveID();
    pIVar2->NavWindow = *(ImGuiWindow **)delta_scroll;
    if (pIVar2->NavId != *(ImGuiID *)((long)delta_scroll + 8)) {
      pIVar2->NavJustMovedToId = *(ImGuiID *)((long)delta_scroll + 8);
      pIVar2->NavJustMovedToFocusScopeId = *(ImGuiID *)((long)delta_scroll + 0xc);
      pIVar2->NavJustMovedToKeyMods = pIVar2->NavMoveKeyMods;
    }
    SetNavID(*(ImGuiID *)((long)delta_scroll + 8),pIVar2->NavLayer,
             *(ImGuiID *)((long)delta_scroll + 0xc),(ImRect *)((long)delta_scroll + 0x10));
    if (((pIVar2->NavMoveFlags & 0x200U) != 0) &&
       ((*(uint *)((long)delta_scroll + 0x20) & 0x100) != 0)) {
      pIVar2->NavNextActivateId = *(ImGuiID *)((long)delta_scroll + 8);
      pIVar2->NavNextActivateFlags = 5;
      pIVar2->NavMoveFlags = pIVar2->NavMoveFlags | 0x800;
    }
    if ((pIVar2->NavMoveFlags & 0x400U) != 0) {
      pIVar2->NavNextActivateId = *(ImGuiID *)((long)delta_scroll + 8);
      pIVar2->NavNextActivateFlags = 0;
    }
    if ((pIVar2->NavMoveFlags & 0x800U) == 0) {
      pIVar2->NavDisableHighlight = false;
      pIVar2->NavMousePosDirty = true;
      pIVar2->NavDisableMouseHover = true;
    }
    return;
  }
  __assert_fail("g.NavWindow && result->Window",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2804,"void ImGui::NavMoveRequestApplyResult()");
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        ImVec2 delta_scroll;
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            delta_scroll.y = result->Window->Scroll.y - scroll_target;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            delta_scroll = ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }

        // Offset our result position so mouse position can be applied immediately after in NavUpdate()
        result->RectRel.TranslateX(-delta_scroll.x);
        result->RectRel.TranslateY(-delta_scroll.y);
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = g.NavMousePosDirty = true;
    }
}